

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

uchar * extra_next_record(ctl_extr_rec *ctl,int length)

{
  int iVar1;
  uchar *puVar2;
  uchar *p;
  int cur_len;
  int length_local;
  ctl_extr_rec *ctl_local;
  
  iVar1 = ctl->cur_len;
  extra_close_record(ctl,0x1c);
  ctl->use_extr = 1;
  if (ctl->bp == (uchar *)0x0) {
    extra_get_record(ctl->isoent,&ctl->limit,(int *)0x0,(int *)0x0);
  }
  else {
    ctl->ce_ptr = ctl->bp + (iVar1 + 1);
    puVar2 = extra_get_record(ctl->isoent,&ctl->limit,&ctl->extr_off,&ctl->extr_loc);
    ctl->bp = puVar2 + -1;
  }
  ctl->cur_len = 0;
  if (ctl->limit - ctl->cur_len < length) {
    extra_next_record(ctl,length);
  }
  return ctl->bp;
}

Assistant:

static unsigned char *
extra_next_record(struct ctl_extr_rec *ctl, int length)
{
	int cur_len = ctl->cur_len;/* save cur_len */

	/* Close the current extra record or Directory Record. */
	extra_close_record(ctl, RR_CE_SIZE);

	/* Get a next extra record. */
	ctl->use_extr = 1;
	if (ctl->bp != NULL) {
		/* Storing data into an extra record. */
		unsigned char *p;

		/* Save the pointer where a CE extension will be
		 * stored to. */
		ctl->ce_ptr = &ctl->bp[cur_len+1];
		p = extra_get_record(ctl->isoent,
		    &ctl->limit, &ctl->extr_off, &ctl->extr_loc);
		ctl->bp = p - 1;/* the base of bp offset is 1. */
	} else
		/* Calculating the size of an extra record. */
		(void)extra_get_record(ctl->isoent,
		    &ctl->limit, NULL, NULL);
	ctl->cur_len = 0;
	/* Check if an extra record is almost full.
	 * If so, get a next one. */
	if (extra_space(ctl) < length)
		(void)extra_next_record(ctl, length);

	return (ctl->bp);
}